

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O2

void __thiscall MemSizeCalculator::calculate(MemSizeCalculator *this)

{
  _Hash_node_base *p_Var1;
  __node_base *p_Var2;
  __node_base *p_Var3;
  Function **function;
  _Hash_node_base *p_Var4;
  
  p_Var2 = &(this->symbolTable->classes)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    calculateClass(this,(Class *)p_Var2[5]._M_nxt);
  }
  p_Var3 = &(this->symbolTable->freeFunctions)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    p_Var1 = p_Var3[6]._M_nxt;
    for (p_Var4 = p_Var3[5]._M_nxt; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
      calculateFunction(this,(Function *)p_Var4->_M_nxt);
    }
  }
  calculateFunction(this,this->symbolTable->main);
  return;
}

Assistant:

void MemSizeCalculator::calculate() {
    for (auto &_class : symbolTable->classes) calculateClass(_class.second);
    for (auto &functions: symbolTable->freeFunctions)
        for (auto &function : functions.second) calculateFunction(function);

    //calculate mem size for main function
    calculateFunction(symbolTable->main);
}